

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O3

void __thiscall IR::Instr::MoveArgs(Instr *this,bool generateByteCodeCapture)

{
  OpCode OVar1;
  Opnd *this_00;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint uVar6;
  undefined4 *puVar7;
  StackSym *pSVar8;
  uint uVar9;
  Instr *this_01;
  Instr *pIVar10;
  Instr *pIVar11;
  
  OVar1 = this->m_opcode;
  if (OVar1 < InlineeStart) {
    if ((OVar1 != CallI) && (OVar1 != CallDirect)) {
LAB_004ba1a5:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0xd81,
                         "(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed)"
                         ,
                         "this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect || this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed"
                        );
      if (!bVar4) goto LAB_004ba512;
      *puVar7 = 0;
    }
  }
  else if ((OVar1 != InlineeStart) && (OVar1 != CallIFixed)) goto LAB_004ba1a5;
  pSVar8 = Opnd::GetStackSym(this->m_src2);
  this_01 = (pSVar8->field_5).m_instrDef;
  pIVar11 = this;
  if ((this_01 != (Instr *)0x0 & pSVar8->field_0x18) == 1) {
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar4) {
LAB_004ba512:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar7 = 0;
    this_01 = (pSVar8->field_5).m_instrDef;
  }
  do {
    if ((this_01->m_src2 == (Opnd *)0x0) ||
       (OVar5 = Opnd::GetKind(this_01->m_src2), OVar5 != OpndKindSym)) {
LAB_004ba482:
      pIVar10 = (Instr *)0x0;
    }
    else {
      this_00 = this_01->m_src2;
      OVar5 = Opnd::GetKind(this_00);
      if (OVar5 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar4) goto LAB_004ba512;
        *puVar7 = 0;
      }
      pp_Var2 = this_00[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar4) goto LAB_004ba512;
        *puVar7 = 0;
      }
      uVar6 = *(uint *)(pp_Var2 + 3);
      uVar9 = uVar6 & 0x100000;
      if ((uVar9 != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar4) goto LAB_004ba512;
        *puVar7 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
        uVar9 = uVar6 & 0x100000;
      }
      if (uVar9 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar4) goto LAB_004ba512;
        *puVar7 = 0;
        uVar6 = *(uint *)(pp_Var2 + 3);
      }
      if (((((uVar6 & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
          (bVar4 = Func::IsInPhase(this->m_func,FGPeepsPhase), !bVar4)) &&
         (bVar4 = Func::IsInPhase(this->m_func,FGBuildPhase), !bVar4)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar4) goto LAB_004ba512;
        *puVar7 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) goto LAB_004ba482;
      pIVar10 = (Instr *)pp_Var2[5];
    }
    if (this_01->m_opcode != ArgOut_A_InlineSpecialized) {
      if (this_01->m_opcode == StartCall) {
        if (pIVar10 == (Instr *)0x0) {
          return;
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
        if (bVar4) {
          *puVar7 = 0;
          return;
        }
        goto LAB_004ba512;
      }
      if (generateByteCodeCapture) {
        GenerateBytecodeArgOutCapture(this_01);
      }
      Move(this_01,pIVar11);
      pIVar11 = this_01;
    }
    this_01 = pIVar10;
    if (pIVar10 == (Instr *)0x0) {
      return;
    }
  } while( true );
}

Assistant:

void Instr::MoveArgs(bool generateByteCodeCapture)
{
    Assert(this->m_opcode == Js::OpCode::InlineeStart || this->m_opcode == Js::OpCode::CallDirect ||
        this->m_opcode == Js::OpCode::CallI || this->m_opcode == Js::OpCode::CallIFixed);
    IR::Instr *argInsertInstr = this;
    this->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        if (generateByteCodeCapture)
        {
            argInstr->GenerateBytecodeArgOutCapture();
        }
        argInstr->Move(argInsertInstr);
        argInsertInstr = argInstr;
        return false;
    });
}